

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O3

void __thiscall amrex::Amr::InitAmr(Amr *this)

{
  Vector<int,_std::allocator<int>_> *pVVar1;
  pointer pcVar2;
  ostringstream *this_00;
  pointer pdVar3;
  pointer piVar4;
  pointer piVar5;
  pointer piVar6;
  pointer pdVar7;
  pointer pIVar8;
  void *pvVar9;
  ulong uVar10;
  bool bVar11;
  uint uVar12;
  int iVar13;
  ostream *poVar14;
  int iVar15;
  long lVar16;
  uint uVar17;
  LevelBld *pLVar18;
  ulong uVar19;
  size_type sVar20;
  long lVar21;
  int ngrid;
  BoxList bl_1;
  int in_finest_1;
  int ngrid_1;
  int in_finest;
  ParmParse pp;
  string log_file_name;
  BoxList bl;
  Box local_4b4;
  BoxList local_498;
  ulong local_478;
  int local_46c;
  Vector<int,_std::allocator<int>_> *local_468;
  Amr *local_460;
  int local_454;
  Vector<double,_std::allocator<double>_> *local_450;
  string local_448;
  ParmParse local_428;
  string *local_3d0;
  string *local_3c8;
  undefined1 local_3c0 [24];
  undefined8 uStack_3a8;
  int aiStack_3a0 [122];
  undefined1 local_1b8 [24];
  undefined8 auStack_1a0 [11];
  ios_base local_148 [280];
  
  pLVar18 = this->levelbld;
  if (pLVar18 == (LevelBld *)0x0) {
    Assert_host("levelbld != nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/amrex/Src/Amr/AMReX_Amr.cpp"
                ,0xe5,"\"ERROR: levelbld is nullptr\"");
    pLVar18 = this->levelbld;
  }
  (**(code **)(*(long *)pLVar18 + 0x10))();
  this->plot_int = -1;
  this->small_plot_int = -1;
  this->last_plotfile = 0;
  this->last_smallplotfile = -1;
  this->last_checkpoint = 0;
  this->record_grid_info = 0;
  this->record_run_info = 0;
  this->file_name_digits = 5;
  this->message_int = 10;
  this->record_run_info_terse = 0;
  this->bUserStopRequest = false;
  this->isPeriodic[2] = false;
  this->isPeriodic[0] = false;
  this->isPeriodic[1] = false;
  pcVar2 = local_3c0 + 0x10;
  local_3c0._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3c0,"amr","");
  ParmParse::ParmParse(&local_428,(string *)local_3c0);
  if ((pointer)local_3c0._0_8_ != pcVar2) {
    operator_delete((void *)local_3c0._0_8_,CONCAT71(local_3c0._17_7_,local_3c0[0x10]) + 1);
  }
  ParmParse::queryAdd<int,_0>
            (&local_428,"regrid_on_restart",&(anonymous_namespace)::regrid_on_restart);
  ParmParse::queryAdd<int,_0>
            (&local_428,"use_efficient_regrid",&(anonymous_namespace)::use_efficient_regrid);
  ParmParse::queryAdd<int,_0>
            (&local_428,"plotfile_on_restart",&(anonymous_namespace)::plotfile_on_restart);
  ParmParse::queryAdd<int,_0>
            (&local_428,"insitu_on_restart",&(anonymous_namespace)::insitu_on_restart);
  ParmParse::queryAdd<int,_0>
            (&local_428,"checkpoint_on_restart",&(anonymous_namespace)::checkpoint_on_restart);
  ParmParse::queryAdd<int,_0>(&local_428,"compute_new_dt_on_regrid",&compute_new_dt_on_regrid);
  ParmParse::queryAdd<int,_0>(&local_428,"mffile_nstreams",&(anonymous_namespace)::mffile_nstreams);
  ParmParse::queryAdd<int,_0>
            (&local_428,"probinit_natonce",&(anonymous_namespace)::probinit_natonce);
  iVar15 = *(int *)(ParallelContext::frames + 0x10);
  if ((anonymous_namespace)::probinit_natonce < *(int *)(ParallelContext::frames + 0x10)) {
    iVar15 = (anonymous_namespace)::probinit_natonce;
  }
  (anonymous_namespace)::probinit_natonce = 1;
  if (1 < iVar15) {
    (anonymous_namespace)::probinit_natonce = iVar15;
  }
  ParmParse::queryAdd<int,_0>(&local_428,"file_name_digits",&this->file_name_digits);
  local_3c8 = &this->initial_grids_file;
  ParmParse::queryAdd(&local_428,"initial_grid_file",local_3c8);
  local_3d0 = &this->regrid_grids_file;
  ParmParse::queryAdd(&local_428,"regrid_file",local_3d0);
  ParmParse::queryAdd<int,_0>(&local_428,"message_int",&this->message_int);
  bVar11 = ParmParse::contains(&local_428,"run_log");
  if (bVar11) {
    local_3c0._8_8_ = (ostream *)0x0;
    local_3c0[0x10] = '\0';
    local_3c0._0_8_ = pcVar2;
    ParmParse::get(&local_428,"run_log",(string *)local_3c0,0);
    setRecordRunInfo(this,(string *)local_3c0);
    if ((pointer)local_3c0._0_8_ != pcVar2) {
      operator_delete((void *)local_3c0._0_8_,CONCAT71(local_3c0._17_7_,local_3c0[0x10]) + 1);
    }
  }
  bVar11 = ParmParse::contains(&local_428,"run_log_terse");
  if (bVar11) {
    local_3c0._8_8_ = (ostream *)0x0;
    local_3c0[0x10] = '\0';
    local_3c0._0_8_ = pcVar2;
    ParmParse::get(&local_428,"run_log_terse",(string *)local_3c0,0);
    setRecordRunInfoTerse(this,(string *)local_3c0);
    if ((pointer)local_3c0._0_8_ != pcVar2) {
      operator_delete((void *)local_3c0._0_8_,CONCAT71(local_3c0._17_7_,local_3c0[0x10]) + 1);
    }
  }
  bVar11 = ParmParse::contains(&local_428,"grid_log");
  if (bVar11) {
    local_3c0._8_8_ = (ostream *)0x0;
    local_3c0[0x10] = '\0';
    local_3c0._0_8_ = pcVar2;
    ParmParse::get(&local_428,"grid_log",(string *)local_3c0,0);
    setRecordGridInfo(this,(string *)local_3c0);
    if ((pointer)local_3c0._0_8_ != pcVar2) {
      operator_delete((void *)local_3c0._0_8_,CONCAT71(local_3c0._17_7_,local_3c0[0x10]) + 1);
    }
  }
  bVar11 = ParmParse::contains(&local_428,"data_log");
  if (bVar11) {
    uVar12 = ParmParse::countval(&local_428,"data_log",-1);
    std::
    vector<std::unique_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_std::allocator<std::unique_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>_>
    ::resize(&(this->datalog).
              super_vector<std::unique_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_fstream<char,_std::char_traits<char>_>_>_>,_std::allocator<std::unique_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_std::default_delete<std::basic_fstream<char,_std::char_traits<char>_>_>_>_>_>
             ,(long)(int)uVar12);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::resize(&(this->datalogname).
              super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ,(long)(int)uVar12);
    ParmParse::queryarr(&local_428,"data_log",
                        &(this->datalogname).
                         super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ,0,uVar12);
    if (0 < (int)uVar12) {
      lVar21 = 0;
      iVar15 = 0;
      do {
        setRecordDataInfo(this,iVar15,
                          (string *)
                          ((long)&(((this->datalogname).
                                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    .
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar21));
        iVar15 = iVar15 + 1;
        lVar21 = lVar21 + 0x20;
      } while ((ulong)uVar12 << 5 != lVar21);
    }
  }
  std::__cxx11::string::_M_replace
            ((ulong)&this->probin_file,0,(char *)(this->probin_file)._M_string_length,0x775019);
  bVar11 = ParmParse::contains(&local_428,"probin_file");
  if (bVar11) {
    ParmParse::get(&local_428,"probin_file",&this->probin_file,0);
  }
  ParmParse::queryAdd(&local_428,"restart",&this->restart_chkfile);
  ParmParse::queryAdd(&local_428,"restart_from_plotfile",&this->restart_pltfile);
  iVar13 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
  iVar15 = iVar13 + 1;
  local_450 = &this->dt_level;
  local_478 = CONCAT44(local_478._4_4_,iVar15);
  sVar20 = (size_type)iVar15;
  std::vector<double,_std::allocator<double>_>::resize
            (&local_450->super_vector<double,_std::allocator<double>_>,sVar20);
  local_468 = &this->level_steps;
  std::vector<int,_std::allocator<int>_>::resize
            (&local_468->super_vector<int,_std::allocator<int>_>,sVar20);
  std::vector<int,_std::allocator<int>_>::resize
            (&(this->level_count).super_vector<int,_std::allocator<int>_>,sVar20);
  std::vector<int,_std::allocator<int>_>::resize
            (&(this->n_cycle).super_vector<int,_std::allocator<int>_>,sVar20);
  std::vector<double,_std::allocator<double>_>::resize
            (&(this->dt_min).super_vector<double,_std::allocator<double>_>,sVar20);
  std::
  vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
  ::resize(&(this->amr_level).
            super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
           ,sVar20);
  if (-1 < iVar13) {
    pdVar3 = (local_450->super_vector<double,_std::allocator<double>_>).
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    piVar4 = (local_468->super_vector<int,_std::allocator<int>_>).
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    piVar5 = (this->level_count).super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    piVar6 = (this->n_cycle).super_vector<int,_std::allocator<int>_>.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    pdVar7 = (this->dt_min).super_vector<double,_std::allocator<double>_>.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    uVar19 = 0;
    do {
      pdVar3[uVar19] = 1e+200;
      piVar4[uVar19] = 0;
      piVar5[uVar19] = 0;
      piVar6[uVar19] = 0;
      pdVar7[uVar19] = 0.0;
      uVar19 = uVar19 + 1;
    } while ((local_478 & 0xffffffff) != uVar19);
  }
  sVar20 = (size_type)(this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
  local_460 = this;
  if (0 < (long)sVar20) {
    std::vector<int,_std::allocator<int>_>::resize
              (&(this->regrid_int).super_vector<int,_std::allocator<int>_>,sVar20);
    if (0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level) {
      piVar4 = (this->regrid_int).super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      lVar21 = 0;
      do {
        piVar4[lVar21] = 1;
        lVar21 = lVar21 + 1;
      } while (lVar21 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level);
    }
  }
  initPltAndChk(this);
  initSubcycle(this);
  local_498.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_finish = (Box *)CONCAT44(local_498.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                              .super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                              super__Vector_impl_data._M_finish._4_4_,
                              (int)local_498.m_lbox.
                                   super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                   _M_impl.super__Vector_impl_data._M_finish);
  if ((this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level < 1) goto LAB_005a9f64;
  iVar15 = ParmParse::countval(&local_428,"regrid_int",-1);
  if (iVar15 == 0) {
    if ((this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose != 0) {
      local_3c0._8_8_ = ErrorStream();
      local_3c0._4_4_ = *(undefined4 *)(DAT_00816950 + -0x48);
      local_3c0._0_4_ = *(undefined4 *)(DAT_00816950 + -0x30);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_3c0 + 0x10));
      *(undefined8 *)
       ((long)&uStack_3a8 + *(long *)(CONCAT71(local_3c0._17_7_,local_3c0[0x10]) + -0x18)) =
           *(undefined8 *)(local_3c0._8_8_ + *(long *)(*(long *)local_3c0._8_8_ + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)(local_3c0 + 0x10),"Using default regrid_int = 1 at all levels!\n",0x2c)
      ;
      Print::~Print((Print *)local_3c0);
    }
LAB_005a9846:
    iVar15 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
  }
  else {
    if (iVar15 != 1) {
      iVar13 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
      if (iVar15 < iVar13) {
        Error_host("You did not specify enough values of regrid_int");
      }
      else {
        ParmParse::queryarr(&local_428,"regrid_int",
                            &(this->regrid_int).super_vector<int,_std::allocator<int>_>,0,iVar13);
      }
      goto LAB_005a9846;
    }
    local_3c0._0_8_ = local_3c0._0_8_ & 0xffffffff00000000;
    ParmParse::query(&local_428,"regrid_int",(int *)local_3c0,0);
    iVar15 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
    if (0 < iVar15) {
      piVar4 = (this->regrid_int).super_vector<int,_std::allocator<int>_>.
               super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start;
      lVar21 = 0;
      do {
        piVar4[lVar21] = local_3c0._0_4_;
        lVar21 = lVar21 + 1;
        iVar15 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
      } while (lVar21 < iVar15);
    }
  }
  if ((0 < iVar15) && ((this->initial_grids_file)._M_string_length != 0)) {
    std::ifstream::ifstream(local_3c0,(local_3c8->_M_dataplus)._M_p,_S_in);
    if (*(int *)((long)aiStack_3a0 + *(long *)(local_3c0._0_8_ + -0x18)) != 0) {
      FileOpenFailed(local_3c8);
    }
    std::istream::operator>>((istream *)local_3c0,(int *)&local_448);
    do {
      iVar15 = std::istream::get();
    } while (iVar15 != 10);
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::resize
              ((vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)&initial_ba,
               (long)(int)local_448._M_dataplus._M_p);
    (this->super_AmrCore).super_AmrMesh.super_AmrInfo.use_fixed_upto_level =
         (int)local_448._M_dataplus._M_p;
    if ((this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level <
        (int)local_448._M_dataplus._M_p) {
      Error_host("You have fewer levels in your inputs file then in your grids file!");
    }
    if (0 < (int)local_448._M_dataplus._M_p) {
      uVar19 = 1;
      do {
        BoxList::BoxList((BoxList *)local_1b8);
        std::istream::operator>>((istream *)local_3c0,(int *)&local_4b4);
        do {
          iVar15 = std::istream::get();
        } while (iVar15 != 10);
        local_478 = uVar19;
        if (0 < local_4b4.smallend.vect[0]) {
          iVar15 = 0;
          do {
            local_498.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x100000001;
            local_498.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_finish._0_4_ = 1;
            local_498.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_finish._4_4_ = 0;
            local_498.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
            local_498.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
            local_498.btype.itype = 0;
            amrex::operator>>((istream *)local_3c0,(Box *)&local_498);
            do {
              iVar13 = std::istream::get();
            } while (iVar13 != 10);
            pIVar8 = (local_460->super_AmrCore).super_AmrMesh.super_AmrInfo.ref_ratio.
                     super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                     super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if (((pIVar8[uVar19 - 1].vect[0] != 1) || (pIVar8[uVar19 - 1].vect[1] != 1)) ||
               (pIVar8[uVar19 - 1].vect[2] != 1)) {
              local_498.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)CONCAT44(local_498.m_lbox.
                                     super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                     _M_impl.super__Vector_impl_data._M_start._4_4_ *
                                     pIVar8[uVar19 - 1].vect[1],
                                     pIVar8[uVar19 - 1].vect[0] *
                                     (int)local_498.m_lbox.
                                          super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
              local_498.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
              super__Vector_impl_data._M_finish._0_4_ =
                   (int)local_498.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                        super__Vector_impl_data._M_finish * pIVar8[uVar19 - 1].vect[2];
              uVar12 = (uint)((local_498.btype.itype & 2) == 0);
              uVar17 = (uint)((local_498.btype.itype & 4) == 0);
              local_498.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
              super__Vector_impl_data._M_finish._4_4_ =
                   (local_498.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_finish._4_4_ + (~local_498.btype.itype & 1)) *
                   pIVar8[uVar19 - 1].vect[0] - (~local_498.btype.itype & 1);
              local_498.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._0_4_ =
                   ((int)local_498.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                         super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage + uVar12) *
                   pIVar8[uVar19 - 1].vect[1] - uVar12;
              local_498.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage._4_4_ =
                   (local_498.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_ + uVar17) *
                   pIVar8[uVar19 - 1].vect[2] - uVar17;
            }
            if (local_1b8._8_8_ == local_1b8._16_8_) {
              std::vector<amrex::Box,std::allocator<amrex::Box>>::
              _M_realloc_insert<amrex::Box_const&>
                        ((vector<amrex::Box,std::allocator<amrex::Box>> *)local_1b8,
                         (iterator)local_1b8._8_8_,(Box *)&local_498);
            }
            else {
              *(ulong *)((IntVect *)(local_1b8._8_8_ + 0xc))->vect =
                   CONCAT44((int)local_498.m_lbox.
                                 super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl
                                 .super__Vector_impl_data._M_end_of_storage,
                            local_498.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data._M_finish._4_4_);
              *(ulong *)(((IntVect *)(local_1b8._8_8_ + 0xc))->vect + 2) =
                   CONCAT44(local_498.btype.itype,
                            local_498.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage._4_4_);
              *(pointer *)((IntVect *)local_1b8._8_8_)->vect =
                   local_498.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_start;
              *(ulong *)(((IntVect *)local_1b8._8_8_)->vect + 2) =
                   CONCAT44(local_498.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data._M_finish._4_4_,
                            (int)local_498.m_lbox.
                                 super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl
                                 .super__Vector_impl_data._M_finish);
              local_1b8._8_8_ = local_1b8._8_8_ + 0x1c;
            }
            iVar15 = iVar15 + 1;
          } while (iVar15 < local_4b4.smallend.vect[0]);
        }
        uVar10 = local_478;
        BoxArray::define((BoxArray *)(initial_ba + local_478 * 0x68 + -0x68),(BoxList *)local_1b8);
        this = local_460;
        pvVar9 = (void *)CONCAT44(local_1b8._4_4_,local_1b8._0_4_);
        if (pvVar9 != (void *)0x0) {
          operator_delete(pvVar9,local_1b8._16_8_ - (long)pvVar9);
        }
        uVar19 = uVar10 + 1;
      } while ((long)uVar10 < (long)(int)local_448._M_dataplus._M_p);
    }
    std::ifstream::close();
    if (0 < (this->super_AmrCore).super_AmrMesh.super_AmrInfo.verbose) {
      local_1b8._8_8_ = OutStream();
      local_1b8._0_4_ = *(int *)(DAT_00816950 + -0x30);
      this_00 = (ostringstream *)(local_1b8 + 0x10);
      local_1b8._4_4_ = *(MPI_Comm *)(DAT_00816950 + -0x48);
      std::__cxx11::ostringstream::ostringstream(this_00);
      *(undefined8 *)
       ((long)auStack_1a0 + *(long *)((((Box *)(local_1b8._16_8_ + -0x1c))->smallend).vect + 1)) =
           *(undefined8 *)
            ((long)((IntVect *)local_1b8._8_8_)->vect +
            *(long *)(*(long *)((IntVect *)local_1b8._8_8_)->vect + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"Read initial_ba. Size is ",0x19);
      std::ostream::_M_insert<long>((long)this_00);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n",1);
      Print::~Print((Print *)local_1b8);
    }
    std::ifstream::~ifstream(local_3c0);
    iVar15 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.max_level;
  }
  local_498.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
  _M_finish = (Box *)CONCAT44(local_498.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                              .super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                              super__Vector_impl_data._M_finish._4_4_,
                              (int)local_498.m_lbox.
                                   super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                   _M_impl.super__Vector_impl_data._M_finish);
  if ((0 < iVar15) &&
     (local_498.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
      super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.super__Vector_impl_data.
      _M_finish = (Box *)CONCAT44(local_498.m_lbox.
                                  super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                  _M_impl.super__Vector_impl_data._M_finish._4_4_,
                                  (int)local_498.m_lbox.
                                       super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                       super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                       _M_impl.super__Vector_impl_data._M_finish),
     (this->regrid_grids_file)._M_string_length != 0)) {
    std::ifstream::ifstream(local_3c0,(local_3d0->_M_dataplus)._M_p,_S_in);
    if (*(int *)((long)aiStack_3a0 + *(long *)(local_3c0._0_8_ + -0x18)) != 0) {
      FileOpenFailed(local_3d0);
    }
    std::istream::operator>>((istream *)local_3c0,&local_46c);
    do {
      iVar15 = std::istream::get();
    } while (iVar15 != 10);
    std::vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::resize
              ((vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)&regrid_ba,
               (long)local_46c);
    if (0 < local_46c) {
      local_468 = (Vector<int,_std::allocator<int>_> *)0x1;
      lVar21 = 0xc;
      do {
        BoxList::BoxList(&local_498);
        std::istream::operator>>((istream *)local_3c0,&local_454);
        do {
          iVar15 = std::istream::get();
        } while (iVar15 != 10);
        if (0 < local_454) {
          iVar15 = 0;
          local_450 = (Vector<double,_std::allocator<double>_> *)((long)local_468 * 3);
          do {
            local_4b4.smallend.vect[0] = 1;
            local_4b4.smallend.vect[1] = 1;
            local_4b4.smallend.vect[2] = 1;
            local_4b4.bigend.vect[0] = 0;
            local_4b4.bigend.vect[1] = 0;
            local_4b4.bigend.vect[2] = 0;
            local_4b4.btype.itype = 0;
            amrex::operator>>((istream *)local_3c0,&local_4b4);
            local_478 = CONCAT44(local_478._4_4_,iVar15);
            do {
              iVar15 = std::istream::get();
            } while (iVar15 != 10);
            pIVar8 = (this->super_AmrCore).super_AmrMesh.super_AmrInfo.ref_ratio.
                     super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                     super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                     super__Vector_impl_data._M_start;
            if (((pIVar8[-1].vect[(long)local_450] != 1) ||
                (pIVar8->vect[(long)(local_450 + 0xffffffffffffffff) + 0x16] != 1)) ||
               (pIVar8->vect[(long)(local_450 + 0xffffffffffffffff) + 0x17] != 1)) {
              local_4b4.smallend.vect[1] =
                   local_4b4.smallend.vect[1] *
                   pIVar8->vect[(long)(local_450 + 0xffffffffffffffff) + 0x16];
              local_4b4.smallend.vect[0] =
                   pIVar8[-1].vect[(long)local_450] * local_4b4.smallend.vect[0];
              local_4b4.smallend.vect[2] =
                   local_4b4.smallend.vect[2] *
                   pIVar8->vect[(long)(local_450 + 0xffffffffffffffff) + 0x17];
              uVar12 = (uint)((local_4b4._20_8_ & 0x200000000) == 0);
              uVar17 = (uint)((local_4b4._20_8_ & 0x400000000) == 0);
              local_4b4.bigend.vect[0] =
                   (local_4b4.bigend.vect[0] + (~local_4b4.btype.itype & 1)) *
                   pIVar8[-1].vect[(long)local_450] - (~local_4b4.btype.itype & 1);
              local_4b4.bigend.vect[1] =
                   (local_4b4.bigend.vect[1] + uVar12) *
                   pIVar8->vect[(long)(local_450 + 0xffffffffffffffff) + 0x16] - uVar12;
              local_4b4.bigend.vect[2] =
                   (local_4b4.bigend.vect[2] + uVar17) *
                   pIVar8->vect[(long)(local_450 + 0xffffffffffffffff) + 0x17] - uVar17;
            }
            lVar16 = 0;
            do {
              if (*(int *)((long)((local_460->super_AmrCore).super_AmrMesh.super_AmrInfo.
                                  max_grid_size.
                                  super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                                  super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->vect +
                          lVar16 * 4 + lVar21) <
                  (local_4b4.bigend.vect[lVar16] - local_4b4.smallend.vect[lVar16]) + 1) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"Grid ",5);
                poVar14 = amrex::operator<<((ostream *)local_1b8,&local_4b4);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14," too large",10);
                local_448._M_dataplus._M_p._0_4_ = CONCAT31(local_448._M_dataplus._M_p._1_3_,10);
                std::__ostream_insert<char,std::char_traits<char>>(poVar14,(char *)&local_448,1);
                std::__cxx11::stringbuf::str();
                Error(&local_448);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(local_448._M_dataplus._M_p._4_4_,(int)local_448._M_dataplus._M_p) !=
                    &local_448.field_2) {
                  operator_delete((undefined1 *)
                                  CONCAT44(local_448._M_dataplus._M_p._4_4_,
                                           (int)local_448._M_dataplus._M_p),
                                  local_448.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
                std::ios_base::~ios_base(local_148);
              }
              lVar16 = lVar16 + 1;
            } while (lVar16 != 3);
            if (local_498.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                (Box *)CONCAT44(local_498.m_lbox.
                                super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage._4_4_,
                                (int)local_498.m_lbox.
                                     super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                     super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage)) {
              std::vector<amrex::Box,std::allocator<amrex::Box>>::
              _M_realloc_insert<amrex::Box_const&>
                        ((vector<amrex::Box,std::allocator<amrex::Box>> *)&local_498,
                         (iterator)
                         local_498.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                         super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                         super__Vector_impl_data._M_finish,&local_4b4);
            }
            else {
              *(ulong *)((local_498.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_finish)->bigend).vect =
                   CONCAT44(local_4b4.bigend.vect[1],local_4b4.bigend.vect[0]);
              *(undefined8 *)
               (((local_498.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                  super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                  super__Vector_impl_data._M_finish)->bigend).vect + 2) = local_4b4._20_8_;
              *(undefined8 *)
               ((local_498.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                 super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                 super__Vector_impl_data._M_finish)->smallend).vect = local_4b4.smallend.vect._0_8_;
              *(ulong *)(((local_498.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                           super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                           super__Vector_impl_data._M_finish)->smallend).vect + 2) =
                   CONCAT44(local_4b4.bigend.vect[0],local_4b4.smallend.vect[2]);
              local_498.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
              super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_498.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
            iVar15 = (int)local_478 + 1;
            this = local_460;
          } while (iVar15 < local_454);
        }
        BoxArray::define((BoxArray *)(regrid_ba + (long)local_468 * 0x68 + -0x68),&local_498);
        if (local_498.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_498.m_lbox.super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          CONCAT44(local_498.m_lbox.
                                   super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                   super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                                   (int)local_498.m_lbox.
                                        super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>.
                                        _M_impl.super__Vector_impl_data._M_end_of_storage) -
                          (long)local_498.m_lbox.
                                super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                                super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        pVVar1 = (Vector<int,_std::allocator<int>_> *)
                 ((long)&(local_468->super_vector<int,_std::allocator<int>_>).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start + 1);
        lVar21 = lVar21 + 0xc;
        bVar11 = (long)local_468 < (long)local_46c;
        local_468 = pVVar1;
      } while (bVar11);
    }
    std::ifstream::close();
    std::ifstream::~ifstream(local_3c0);
  }
LAB_005a9f64:
  this->loadbalance_with_workestimates = 0;
  ParmParse::queryAdd<int,_0>
            (&local_428,"loadbalance_with_workestimates",&this->loadbalance_with_workestimates);
  this->loadbalance_level0_int = 2;
  ParmParse::queryAdd<int,_0>(&local_428,"loadbalance_level0_int",&this->loadbalance_level0_int);
  this->loadbalance_max_fac = 1.5;
  ParmParse::queryAdd<double,_0>(&local_428,"loadbalance_max_fac",&this->loadbalance_max_fac);
  std::
  deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~deque((deque<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&local_428);
  return;
}

Assistant:

void
Amr::InitAmr ()
{
    BL_PROFILE("Amr::InitAmr()");

    AMREX_ALWAYS_ASSERT_WITH_MESSAGE(levelbld != nullptr, "ERROR: levelbld is nullptr");
    //
    // Global function that define state variables.
    //
    levelbld->variableSetUp();
    //
    // Set default values.
    //
    plot_int               = -1;
    small_plot_int         = -1;
    last_plotfile          = 0;
    last_smallplotfile     = -1;
    last_checkpoint        = 0;
    record_run_info        = false;
    record_grid_info       = false;
    file_name_digits       = 5;
    record_run_info_terse  = false;
    bUserStopRequest       = false;
    message_int            = 10;
#if defined(AMREX_USE_SENSEI_INSITU) && !defined(AMREX_NO_SENSEI_AMR_INST)
    insitu_bridge          = nullptr;
#endif

    for (int i = 0; i < AMREX_SPACEDIM; i++)
        isPeriodic[i] = false;

    ParmParse pp("amr");
    //
    // Check for command line flags.
    //
    pp.queryAdd("regrid_on_restart",regrid_on_restart);
    pp.queryAdd("use_efficient_regrid",use_efficient_regrid);
    pp.queryAdd("plotfile_on_restart",plotfile_on_restart);
    pp.queryAdd("insitu_on_restart",insitu_on_restart);
    pp.queryAdd("checkpoint_on_restart",checkpoint_on_restart);

    pp.queryAdd("compute_new_dt_on_regrid",compute_new_dt_on_regrid);

    pp.queryAdd("mffile_nstreams", mffile_nstreams);

#ifndef AMREX_NO_PROBINIT
    pp.queryAdd("probinit_natonce", probinit_natonce);
    probinit_natonce = std::max(1, std::min(ParallelDescriptor::NProcs(), probinit_natonce));
#endif

    pp.queryAdd("file_name_digits", file_name_digits);

    pp.queryAdd("initial_grid_file",initial_grids_file);
    pp.queryAdd("regrid_file"      , regrid_grids_file);

    pp.queryAdd("message_int", message_int);

    if (pp.contains("run_log"))
    {
        std::string log_file_name;
        pp.get("run_log",log_file_name);
        setRecordRunInfo(log_file_name);
    }
    if (pp.contains("run_log_terse"))
    {
        std::string log_file_name;
        pp.get("run_log_terse",log_file_name);
        setRecordRunInfoTerse(log_file_name);
    }
    if (pp.contains("grid_log"))
    {
        std::string grid_file_name;
        pp.get("grid_log",grid_file_name);
        setRecordGridInfo(grid_file_name);
    }

    if (pp.contains("data_log"))
    {
      int num_datalogs = pp.countval("data_log");
      datalog.resize(num_datalogs);
      datalogname.resize(num_datalogs);
      pp.queryarr("data_log",datalogname,0,num_datalogs);
      for (int i = 0; i < num_datalogs; i++)
        setRecordDataInfo(i,datalogname[i]);
    }

#ifndef AMREX_NO_PROBINIT
    probin_file = "probin";  // Make "probin" the default

    if (pp.contains("probin_file"))
    {
        pp.get("probin_file",probin_file);
    }
#endif
    //
    // If set, then restart from checkpoint file.
    //
    pp.queryAdd("restart", restart_chkfile);
    //
    // If set, then restart from plotfile.
    //
    pp.queryAdd("restart_from_plotfile", restart_pltfile);

    int nlev     = max_level+1;
    dt_level.resize(nlev);
    level_steps.resize(nlev);
    level_count.resize(nlev);
    n_cycle.resize(nlev);
    dt_min.resize(nlev);
    amr_level.resize(nlev);
    //
    // Set bogus values.
    //
    for (int i = 0; i < nlev; i++)
    {

        // Something nonzero so old & new will differ
#ifdef AMREX_USE_FLOAT
        dt_level[i]    = 1.e30f;
#else
        dt_level[i]    = 1.e200;
#endif
        level_steps[i] = 0;
        level_count[i] = 0;
        n_cycle[i]     = 0;
        dt_min[i]      = 0.0;
    }

    // Make the default regrid_int = 1 for all levels.
    if (max_level > 0)
    {
       regrid_int.resize(max_level);
       for (int i = 0; i < max_level; i++)
           regrid_int[i]  = 1;
    }

    //
    // Setup plot and checkpoint controls.
    //
    initPltAndChk();

    //
    // Setup insitu controls
    //
    initInSitu();

    //
    // Setup subcycling controls.
    //
    initSubcycle();

    //
    // Read in the regrid interval if max_level > 0.
    //
    if (max_level > 0)
    {
       int numvals = pp.countval("regrid_int");
       if (numvals == 1)
       {
           //
           // Set all values to the single available value.
           //
           int the_regrid_int = 0;
           pp.query("regrid_int",the_regrid_int);
           for (int i = 0; i < max_level; i++)
           {
               regrid_int[i] = the_regrid_int;
           }
       }
       else if (numvals == 0)
       {
           if (verbose) {
               amrex::Print(amrex::ErrorStream()) << "Using default regrid_int = 1 at all levels!\n";
           }
       }
       else if (numvals < max_level)
       {
           amrex::Error("You did not specify enough values of regrid_int");
       }
       else
       {
           //
           // Otherwise we expect a vector of max_level values
           //
           pp.queryarr("regrid_int",regrid_int,0,max_level);
       }
    }

    if (max_level > 0 && !initial_grids_file.empty())
    {
#define STRIP while( is.get() != '\n' ) {}
        std::ifstream is(initial_grids_file.c_str(),std::ios::in);

        if (!is.good())
            amrex::FileOpenFailed(initial_grids_file);

        int in_finest,ngrid;

        is >> in_finest;
        STRIP;
        initial_ba.resize(in_finest);

        use_fixed_upto_level = in_finest;
        if (in_finest > max_level)
           amrex::Error("You have fewer levels in your inputs file then in your grids file!");

        for (int lev = 1; lev <= in_finest; lev++)
        {
            BoxList bl;
            is >> ngrid;
            STRIP;
            for (int i = 0; i < ngrid; i++)
            {
                Box bx;
                is >> bx;
                STRIP;
                bx.refine(ref_ratio[lev-1]);
                bl.push_back(bx);
            }
            initial_ba[lev-1].define(bl);
        }
        is.close();
        if (verbose > 0) {
            amrex::Print() << "Read initial_ba. Size is " << initial_ba.size() << "\n";
        }

#undef STRIP
    }

    if (max_level > 0 && !regrid_grids_file.empty())
    {
#define STRIP while( is.get() != '\n' ) {}
        std::ifstream is(regrid_grids_file.c_str(),std::ios::in);

        if (!is.good())
            amrex::FileOpenFailed(regrid_grids_file);

        int in_finest,ngrid;

        is >> in_finest;
        STRIP;
        regrid_ba.resize(in_finest);
        for (int lev = 1; lev <= in_finest; lev++)
        {
            BoxList bl;
            is >> ngrid;
            STRIP;
            for (int i = 0; i < ngrid; i++)
            {
                Box bx;
                is >> bx;
                STRIP;
                 bx.refine(ref_ratio[lev-1]);
                 for (int idim = 0 ; idim < AMREX_SPACEDIM; ++idim)
                 {
                     if (bx.length(idim) > max_grid_size[lev][idim])
                     {
                         std::ostringstream ss;
                         ss << "Grid " << bx << " too large" << '\n';
                         amrex::Error(ss.str());
                     }
                 }
                 bl.push_back(bx);
            }
            regrid_ba[lev-1].define(bl);
        }
        is.close();
#undef STRIP
    }

    loadbalance_with_workestimates = 0;
    pp.queryAdd("loadbalance_with_workestimates", loadbalance_with_workestimates);

    loadbalance_level0_int = 2;
    pp.queryAdd("loadbalance_level0_int", loadbalance_level0_int);

    loadbalance_max_fac = 1.5;
    pp.queryAdd("loadbalance_max_fac", loadbalance_max_fac);
}